

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::default_cost_type<double>::make_loo_norm(default_cost_type<double> *this,int n)

{
  double dVar1;
  double *pdVar2;
  ulong uVar3;
  
  pdVar2 = (this->linear_elements)._M_t.
           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  pdVar2 = std::__max_element<double*,__gnu_cxx::__ops::_Iter_less_iter>(pdVar2,pdVar2 + n);
  dVar1 = *pdVar2;
  if ((uint)((ulong)((long)ABS(dVar1) + -0x10000000000000) >> 0x35) < 0x3ff) {
    pdVar2 = (this->linear_elements)._M_t.
             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    for (uVar3 = 0; (uint)n != uVar3; uVar3 = uVar3 + 1) {
      pdVar2[uVar3] = pdVar2[uVar3] / dVar1;
    }
  }
  return;
}

Assistant:

void make_loo_norm(int n)
    {
        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }